

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rearrangeFunctions.cpp
# Opt level: O2

void __thiscall GraphSam::addConnection(GraphSam *this,int parent,int child)

{
  pointer psVar1;
  GraphNode *this_00;
  __shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  bool bVar4;
  __shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2> *__r;
  pointer psVar5;
  __weak_ptr<GraphNode,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  psVar5 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar5 == psVar1) {
      return;
    }
    this_00 = (psVar5->super___shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (this_00->m_value == parent) {
      bVar4 = GraphNode::hasPointer(this_00,child);
      if (bVar4) {
        return;
      }
      p_Var2 = &((this->m_nodes).
                 super__Vector_base<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>;
      for (__r = &((this->m_nodes).
                   super__Vector_base<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>; __r != p_Var2;
          __r = __r + 1) {
        if (__r->_M_ptr->m_value == child) {
          peVar3 = (psVar5->super___shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__weak_ptr<GraphNode,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<GraphNode,void>
                    (local_40,__r);
          std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>::
          push_back(&peVar3->m_pointers,(value_type *)local_40);
          std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_38);
        }
      }
    }
    psVar5 = psVar5 + 1;
  } while( true );
}

Assistant:

void GraphSam::addConnection(int parent, int child) {

    // Search for parent node
    for (auto &n : m_nodes) {
        if (n->getValue() == parent) {

            // Avoid circular connections
            if (n->hasPointer(child))
                return;

            // Search for child node
            for (const auto &m : m_nodes) {
                if (m->getValue() == child)
                    n->addPointer(m);
            }

        }
    }

}